

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
          (TOIDecPOMDPDiscrete *this,string *name,string *descr,string *pf,bool cacheFlatModels)

{
  *(undefined ***)&this->field_0x2b8 = &PTR__POSGInterface_00609d08;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)&this->field_0x2b8,&PTR_PTR_00608e00);
  *(undefined8 *)&this->field_0x2c0 = 0x609ef0;
  *(undefined8 *)&this->field_0x2b8 = 0x60a0a0;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)&this->field_0x2b8,&PTR_construction_vtable_232__00608dd8)
  ;
  TransitionObservationIndependentMADPDiscrete::TransitionObservationIndependentMADPDiscrete
            (&this->super_TransitionObservationIndependentMADPDiscrete,
             &PTR_construction_vtable_72__00608d60,name,descr,pf,cacheFlatModels);
  DecPOMDP::DecPOMDP((DecPOMDP *)
                     &(this->super_TransitionObservationIndependentMADPDiscrete).field_0x280,
                     &PTR_construction_vtable_176__00608d88);
  *(undefined8 *)
   &(this->super_TransitionObservationIndependentMADPDiscrete).super_MultiAgentDecisionProcess =
       0x6085a8;
  *(undefined8 *)&this->field_0x2b8 = 0x608988;
  *(undefined8 *)&this->field_0x2c0 = 0x608be0;
  *(undefined8 *)&(this->super_TransitionObservationIndependentMADPDiscrete).field_0x280 = 0x608800;
  this->_m_initialized = false;
  this->_m_p_rModel = (RewardModelTOISparse *)0x0;
  (this->_m_individualDecPOMDPDs).
  super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_individualDecPOMDPDs).
  super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_individualDecPOMDPDs).
  super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TOIDecPOMDPDiscrete::
TOIDecPOMDPDiscrete(
    const string &name, const string &descr, const string &pf, 
    bool cacheFlatModels) :
    TransitionObservationIndependentMADPDiscrete(name, descr, pf, 
                                                 cacheFlatModels)
{
    _m_initialized = false;
    _m_p_rModel = 0;
}